

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall BpTree<float>::IsFew(BpTree<float> *this,IndexNode<float> *Node)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  bool bVar5;
  IndexNode<float> local_88;
  int local_24;
  IndexNode<float> *pIStack_20;
  int i;
  IndexNode<float> *Node_local;
  BpTree<float> *this_local;
  
  pIStack_20 = Node;
  Node_local = (IndexNode<float> *)this;
  IndexNode<float>::IndexNode(&local_88,Node);
  iVar1 = IsLeaf(this,&local_88);
  IndexNode<float>::~IndexNode(&local_88);
  if (iVar1 == 0) {
    local_24 = 0;
    while( true ) {
      bVar5 = false;
      if (local_24 < this->N) {
        pvVar4 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&Node->p,(long)local_24);
        bVar5 = pvVar4->FileOff != -1;
      }
      iVar1 = local_24;
      if (!bVar5) break;
      local_24 = local_24 + 1;
    }
    iVar2 = min_points_nonleaf(this->N);
    bVar5 = iVar1 < iVar2;
  }
  else {
    local_24 = 0;
    while( true ) {
      bVar5 = false;
      if (local_24 < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&Node->v,(long)local_24);
        bVar5 = *pvVar3 == '1';
      }
      iVar1 = local_24;
      if (!bVar5) break;
      local_24 = local_24 + 1;
    }
    iVar2 = min_key_leaf(this->N);
    bVar5 = iVar1 < iVar2;
  }
  this_local._4_4_ = (uint)bVar5;
  return this_local._4_4_;
}

Assistant:

int BpTree<K>::IsFew(IndexNode<K> Node) {
	int i;
	if (this->IsLeaf(Node)) {
		for (i = 0; i < N - 1 && Node.v[i] == '1'; i++);
		return i < MIN_KEY_LEAF;
	}
	else {
		for (i = 0; i < N && Node.p[i].FileOff != -1; i++);
		return i < MIN_POINTS_NONLEAF;
	}
}